

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

int __thiscall despot::Parser::NumInitialStates(Parser *this)

{
  pointer pSVar1;
  pointer pTVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  double dVar8;
  
  dVar8 = LogNumInitialStates(this);
  iVar3 = -1;
  if (dVar8 <= 30.0) {
    if ((this->prev_state_vars_).
        super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        (this->prev_state_vars_).
        super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
        super__Vector_impl_data._M_start) {
      iVar3 = 1;
    }
    else {
      iVar3 = 1;
      uVar7 = 0;
      do {
        pSVar1 = (this->prev_state_vars_).
                 super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar5 = 0;
        if (0 < (int)((ulong)((long)*(pointer *)
                                     ((long)&pSVar1[uVar7].super_NamedVar.super_Variable.values_ + 8
                                     ) -
                             *(long *)&pSVar1[uVar7].super_NamedVar.super_Variable.values_.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data) >> 5)) {
          iVar6 = 0;
          iVar5 = 0;
          do {
            pTVar2 = (this->initial_belief_funcs_).
                     super__Vector_base<despot::TabularCPT,_std::allocator<despot::TabularCPT>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            dVar8 = (double)(**(code **)((long)pTVar2[uVar7].super_CPT.super_Function._vptr_Function
                                        + 0x20))(pTVar2 + uVar7,0,iVar6);
            iVar5 = iVar5 + (uint)(0.0 < dVar8);
            iVar6 = iVar6 + 1;
            pSVar1 = (this->prev_state_vars_).
                     super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl
                     .super__Vector_impl_data._M_start;
          } while (iVar6 < (int)((ulong)((long)*(pointer *)
                                                ((long)&pSVar1[uVar7].super_NamedVar.super_Variable.
                                                        values_ + 8) -
                                        *(long *)&pSVar1[uVar7].super_NamedVar.super_Variable.
                                                  values_.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data) >> 5));
        }
        iVar3 = iVar3 * iVar5;
        uVar7 = uVar7 + 1;
        uVar4 = ((long)(this->prev_state_vars_).
                       super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->prev_state_vars_).
                       super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 6) * -0x5555555555555555;
      } while (uVar7 <= uVar4 && uVar4 - uVar7 != 0);
    }
  }
  return iVar3;
}

Assistant:

int Parser::NumInitialStates() const {
	if (LogNumInitialStates() > 30) {
		return -1;
	} else {
		int num_states = 1;

		for (int s = 0; s < prev_state_vars_.size(); s++) {
			int n = 0;
			for (int v = 0; v < prev_state_vars_[s].Size(); v++)
				n += (initial_belief_funcs_[s].GetValue(0, v) > 0);
			num_states *= n;
		}

		return num_states;
	}
}